

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

void fsg_model_write_fsm_trans(fsg_model_t *fsg,int i,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  fsg_arciter_t *itor;
  gnode_t *pgVar4;
  char *pcVar5;
  float64 fVar6;
  
  for (itor = fsg_model_arcs(fsg,i); itor != (fsg_arciter_t *)0x0; itor = fsg_arciter_next(itor)) {
    pgVar4 = itor->gn;
    if (pgVar4 == (gnode_t *)0x0) {
      pgVar4 = (gnode_t *)&itor->null_itor->ent->val;
    }
    puVar3 = (uint *)(pgVar4->data).ptr;
    pcVar5 = "<eps>";
    if (-1 < (long)(int)puVar3[3]) {
      pcVar5 = fsg->vocab[(int)puVar3[3]];
    }
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    fVar6 = logmath_log_to_ln(fsg->lmath,(int)((float)(int)puVar3[2] / (float)fsg->lw));
    fprintf((FILE *)fp,"%d %d %s %f\n",-(double)fVar6,(ulong)uVar1,(ulong)uVar2,pcVar5);
  }
  return;
}

Assistant:

static void
fsg_model_write_fsm_trans(fsg_model_t * fsg, int i, FILE * fp)
{
    fsg_arciter_t *itor;

    for (itor = fsg_model_arcs(fsg, i); itor;
         itor = fsg_arciter_next(itor)) {
        fsg_link_t *tl = fsg_arciter_get(itor);
        fprintf(fp, "%d %d %s %f\n",
                tl->from_state, tl->to_state,
                (tl->wid < 0) ? "<eps>" : fsg_model_word_str(fsg, tl->wid),
                -logmath_log_to_ln(fsg->lmath, tl->logs2prob / fsg->lw));
    }
}